

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O3

void __thiscall Mask::MoveBack(Mask *this)

{
  int *piVar1;
  int iVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = (this->super_MobileElement).start_;
  if (0 < iVar2) {
    (this->super_MobileElement).start_ = iVar2 + -1;
    piVar1 = &(this->super_MobileElement).footprint_;
    *piVar1 = *piVar1 + 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Attempting to assign negative start position to Mask object \'",
                 &(this->super_MobileElement).name_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_60 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Mask::MoveBack() {
  if (start_ > 0) {
    start_--;
    footprint_++;
  } else {
    throw std::runtime_error(
        "Attempting to assign negative start position to Mask object '" +
        name_ + "'.");
  }
}